

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_0::TestWebSocketService::request
          (TestWebSocketService *this,HttpMethod method,StringPtr url,HttpHeaders *headers,
          AsyncInputStream *requestBody,Response *response)

{
  bool bVar1;
  NullableValue<kj::StringPtr> *other;
  StringPtr *pSVar2;
  RefOrVoid<kj::WebSocket> pWVar3;
  undefined4 in_register_00000034;
  long lVar4;
  HttpHeaderId id;
  StringPtr message;
  HttpHeaderId id_00;
  long *in_stack_00000010;
  Fault local_1c0;
  Fault f_1;
  undefined1 local_1a8 [16];
  Own<kj::WebSocket,_std::nullptr_t> ws;
  unsigned_long local_178;
  Maybe<unsigned_long> local_170;
  StringPtr local_160;
  Own<kj::AsyncOutputStream,_std::nullptr_t> local_150;
  StringPtr local_140;
  String local_130;
  undefined8 local_118;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  StringPtr *local_100;
  StringPtr *h;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  Maybe<kj::StringPtr> local_e8;
  undefined1 local_d0 [8];
  NullableValue<kj::StringPtr> _h2543;
  HttpHeaders responseHeaders;
  Fault local_48;
  Fault f;
  DebugExpression<bool> _kjCondition;
  HttpHeaders *headers_local;
  HttpMethod method_local;
  TestWebSocketService *this_local;
  StringPtr url_local;
  
  lVar4 = CONCAT44(in_register_00000034,method);
  this_local = (TestWebSocketService *)url.content.size_;
  url_local.content.ptr = (char *)headers;
  url_local.content.size_ = (size_t)this;
  f.exception._6_1_ = HttpHeaders::isWebSocket((HttpHeaders *)requestBody);
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              (&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x9ec,FAILED,"headers.isWebSocket()","_kjCondition,",
               (DebugExpression<bool> *)((long)&f.exception + 7));
    kj::_::Debug::Fault::fatal(&local_48);
  }
  HttpHeaders::HttpHeaders
            ((HttpHeaders *)&_h2543.field_1.value.content.size_,*(HttpHeaderTable **)(lVar4 + 0x10))
  ;
  h = *(StringPtr **)*(undefined1 (*) [12])(lVar4 + 0x18);
  uStack_f0 = (undefined4)*(undefined8 *)(lVar4 + 0x20);
  uStack_ec = (undefined4)((ulong)*(undefined8 *)(lVar4 + 0x20) >> 0x20);
  id_00._12_4_ = 0;
  id_00._0_12_ = *(undefined1 (*) [12])(lVar4 + 0x18);
  HttpHeaders::get(&local_e8,(HttpHeaders *)requestBody,id_00);
  other = kj::_::readMaybe<kj::StringPtr>(&local_e8);
  kj::_::NullableValue<kj::StringPtr>::NullableValue((NullableValue<kj::StringPtr> *)local_d0,other)
  ;
  Maybe<kj::StringPtr>::~Maybe(&local_e8);
  pSVar2 = kj::_::NullableValue::operator_cast_to_StringPtr_((NullableValue *)local_d0);
  if (pSVar2 != (StringPtr *)0x0) {
    local_100 = kj::_::NullableValue<kj::StringPtr>::operator*
                          ((NullableValue<kj::StringPtr> *)local_d0);
    local_118 = *(undefined8 *)(lVar4 + 0x18);
    uStack_110 = (undefined4)*(undefined8 *)(lVar4 + 0x20);
    uStack_10c = (undefined4)((ulong)*(undefined8 *)(lVar4 + 0x20) >> 0x20);
    str<char_const(&)[9],kj::StringPtr&>
              (&local_130,(kj *)"respond-",(char (*) [9])local_100,local_100);
    id.id = uStack_110;
    id.table = (HttpHeaderTable *)local_118;
    id._12_4_ = 0;
    HttpHeaders::set((HttpHeaders *)&_h2543.field_1.value.content.size_,id,&local_130);
    String::~String(&local_130);
  }
  kj::_::NullableValue<kj::StringPtr>::~NullableValue((NullableValue<kj::StringPtr> *)local_d0);
  StringPtr::StringPtr(&local_140,"/return-error");
  bVar1 = StringPtr::operator==((StringPtr *)&this_local,&local_140);
  if (bVar1) {
    StringPtr::StringPtr(&local_160,"Not Found");
    local_178 = 0;
    Maybe<unsigned_long>::Maybe(&local_170,&local_178);
    (**(code **)*in_stack_00000010)
              (&local_150,in_stack_00000010,0x194,local_160.content.ptr,local_160.content.size_,
               (undefined1 *)((long)&_h2543.field_1 + 8),&local_170);
    Own<kj::AsyncOutputStream,_std::nullptr_t>::~Own(&local_150);
    Maybe<unsigned_long>::~Maybe(&local_170);
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  }
  else {
    StringPtr::StringPtr((StringPtr *)&ws.ptr,"/websocket");
    bVar1 = StringPtr::operator==((StringPtr *)&this_local,(StringPtr *)&ws.ptr);
    if (!bVar1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16],kj::StringPtr&>
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x9fa,FAILED,(char *)0x0,"\"unexpected path\", url",
                 (char (*) [16])"unexpected path",(StringPtr *)&this_local);
      kj::_::Debug::Fault::fatal(&local_1c0);
    }
    (**(code **)(*in_stack_00000010 + 8))
              (local_1a8 + 8,in_stack_00000010,(undefined1 *)((long)&_h2543.field_1 + 8));
    pWVar3 = Own<kj::WebSocket,_std::nullptr_t>::operator*
                       ((Own<kj::WebSocket,_std::nullptr_t> *)(local_1a8 + 8));
    StringPtr::StringPtr((StringPtr *)&f_1,"start-inline");
    message.content.size_ = (size_t)f_1.exception;
    message.content.ptr = (char *)pWVar3;
    doWebSocket((WebSocket *)local_1a8,message);
    mv<kj::Own<kj::WebSocket,decltype(nullptr)>>
              ((Own<kj::WebSocket,_std::nullptr_t> *)(local_1a8 + 8));
    Promise<void>::attach<kj::Own<kj::WebSocket,decltype(nullptr)>>
              ((Promise<void> *)this,(Own<kj::WebSocket,_std::nullptr_t> *)local_1a8);
    Promise<void>::~Promise((Promise<void> *)local_1a8);
    Own<kj::WebSocket,_std::nullptr_t>::~Own((Own<kj::WebSocket,_std::nullptr_t> *)(local_1a8 + 8));
  }
  HttpHeaders::~HttpHeaders((HttpHeaders *)&_h2543.field_1.value.content.size_);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> request(
      HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
      kj::AsyncInputStream& requestBody, Response& response) override {
    KJ_ASSERT(headers.isWebSocket());

    HttpHeaders responseHeaders(headerTable);
    KJ_IF_SOME(h, headers.get(hMyHeader)) {
      responseHeaders.set(hMyHeader, kj::str("respond-", h));
    }

    if (url == "/return-error") {
      response.send(404, "Not Found", responseHeaders, uint64_t(0));
      return kj::READY_NOW;
    } else if (url == "/websocket") {
      auto ws = response.acceptWebSocket(responseHeaders);
      return doWebSocket(*ws, "start-inline").attach(kj::mv(ws));
    } else {
      KJ_FAIL_ASSERT("unexpected path", url);
    }
  }